

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

int nlohmann::
    json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::array_index(string *s)

{
  size_t sVar1;
  size_t sVar2;
  out_of_range *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  size_t sStack_18;
  int res;
  size_t processed_chars;
  string *s_local;
  
  sStack_18 = 0;
  processed_chars = (size_t)s;
  local_1c = std::__cxx11::stoi(s,&stack0xffffffffffffffe8,10);
  sVar1 = sStack_18;
  sVar2 = std::__cxx11::string::size();
  if (sVar1 == sVar2) {
    return local_1c;
  }
  __return_storage_ptr__ = (out_of_range *)__cxa_allocate_exception(0x20);
  std::operator+(&local_60,"unresolved reference token \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 processed_chars);
  std::operator+(&local_40,&local_60,"\'");
  detail::out_of_range::create(__return_storage_ptr__,0x194,&local_40);
  __cxa_throw(__return_storage_ptr__,&detail::out_of_range::typeinfo,
              detail::out_of_range::~out_of_range);
}

Assistant:

static int array_index(const std::string& s) {
		std::size_t processed_chars = 0;
		const int res = std::stoi(s, &processed_chars);

		// check if the string was completely read
		if (JSON_UNLIKELY(processed_chars != s.size())) {
			JSON_THROW(detail::out_of_range::create(404, "unresolved reference token '" + s + "'"));
		}

		return res;
	}